

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_files_list.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  _func_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_string_ptr
  *getFilesListFunc;
  size_t sVar2;
  char *pcVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *archivePath;
  string *archivePath_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  archivePaths;
  allocator_type local_a1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48 [2];
  long local_38 [2];
  
  lVar1 = dlopen("../libcpio-lite.so",2);
  if (lVar1 == 0) {
    pcVar3 = "Failed to load cpio-lite.so: ";
    lVar1 = 0x1d;
  }
  else {
    getFilesListFunc =
         (_func_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_string_ptr
          *)dlsym(lVar1,"getFilesList");
    if (getFilesListFunc !=
        (_func_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_string_ptr
         *)0x0) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"./testfiles/cpio_archives/directory.cpio","");
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"./testfiles/cpio_archives/onetwothree.cpio","");
      plVar4 = local_38;
      local_48[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"./testfiles/cpio_archives/links_dirs_regs.cpio","");
      __l._M_len = 3;
      __l._M_array = &local_88;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a0,__l,&local_a1);
      lVar1 = -0x60;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar1 = lVar1 + 0x20;
        archivePath_00 =
             local_a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar1 != 0);
      for (; archivePath_00 !=
             local_a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; archivePath_00 = archivePath_00 + 1) {
        getAndPrintFilesList(getFilesListFunc,archivePath_00);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a0);
      return 0;
    }
    pcVar3 = "Failed to find symbol \'getFilesList\': ";
    lVar1 = 0x26;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar1);
  pcVar3 = (char *)dlerror();
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1060a0);
  }
  else {
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  return -1;
}

Assistant:

int main() 
{
	void* handle = dlopen("../libcpio-lite.so", RTLD_NOW);
	if (handle == nullptr) {
		cout << "Failed to load cpio-lite.so: " << dlerror() << endl;		
		return -1;
	}
	auto getFilesListFunc = (decltype(&getFilesList)) dlsym(handle, "getFilesList");
	if (getFilesListFunc == nullptr) {
		cout << "Failed to find symbol 'getFilesList': " << dlerror() << endl;
		return -1;
	}

	vector<string> archivePaths{"./testfiles/cpio_archives/directory.cpio", "./testfiles/cpio_archives/onetwothree.cpio", "./testfiles/cpio_archives/links_dirs_regs.cpio"};	

	try
	{
		for (const auto& archivePath : archivePaths)
			getAndPrintFilesList(getFilesListFunc, archivePath);
		
	}
	catch (CpioException& e)
	{
		cout << e.what() << ", error type: " << e.errorType() << endl;
		return -1;
	}
	catch (PosixException& e)
	{
		cout << e.what() << ", error code: " << e.errorCode() << endl;
		return -1;
	}
}